

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpData.cc
# Opt level: O0

void __thiscall tt::net::HttpData::handleWrite(HttpData *this)

{
  element_type *this_00;
  __uint32_t *p_Var1;
  ssize_t sVar2;
  long lVar3;
  __uint32_t *events_;
  HttpData *this_local;
  
  if (((this->error_ & 1U) == 0) && (this->connectionState_ != H_DISCONNECTED)) {
    this_00 = std::__shared_ptr_access<tt::net::Channel,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<tt::net::Channel,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&this->channel_);
    p_Var1 = Channel::getEvents(this_00);
    sVar2 = writen(this->fd_,&this->outBuffer_);
    if (sVar2 < 0) {
      perror("writen");
      *p_Var1 = 0;
      this->error_ = true;
    }
    lVar3 = std::__cxx11::string::size();
    if (lVar3 != 0) {
      *p_Var1 = *p_Var1 | 4;
    }
  }
  return;
}

Assistant:

void HttpData::handleWrite() {
  if (!error_ && connectionState_ != H_DISCONNECTED) {
    __uint32_t &events_ = channel_->getEvents();
    if (writen(fd_, outBuffer_) < 0) {
      perror("writen");
      events_ = 0;
      error_ = true;
    }
    if (outBuffer_.size() > 0) events_ |= EPOLLOUT;
  }
}